

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

string * __thiscall pbrt::ParameterDictionary::ToString_abi_cxx11_(ParameterDictionary *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  RGBColorSpace *in_RDI;
  ParsedParameter *in_stack_000000d8;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  string *s;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffed0;
  RGBColorSpace *this_00;
  allocator<char> *__a;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  ParsedParameter *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  __a = &local_12;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,
             (char *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),__a);
  std::allocator<char>::~allocator(&local_12);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(in_RSI);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          ::end(in_stack_fffffffffffffed0);
  local_40 = __lhs;
  for (; local_38 != local_40;
      local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_38->_M_string_length) {
    local_48 = *(ParsedParameter **)local_38;
    ParsedParameter::ToString_abi_cxx11_(in_stack_000000d8);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffed0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffed0);
    std::__cxx11::string::operator+=((string *)this_00,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
  }
  bVar1 = 0;
  if (in_RSI[1].alloc.memoryResource != (memory_resource *)0x0) {
    RGBColorSpace::ToString_abi_cxx11_(in_RDI);
    bVar1 = 1;
    std::__cxx11::string::c_str();
  }
  StringPrintf<char_const*>((char *)this_00,(char **)in_RSI);
  std::__cxx11::string::operator+=((string *)this_00,local_c8);
  std::__cxx11::string::~string(local_c8);
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  }
  std::__cxx11::string::operator+=((string *)this_00,"]");
  return (string *)in_RDI;
}

Assistant:

std::string ParameterDictionary::ToString() const {
    std::string s = "[ ParameterDictionary params: ";
    for (const ParsedParameter *p : params) {
        s += "[ " + p->ToString() + "] ";
    }
    s += StringPrintf("colorSpace: %s ",
                      colorSpace ? colorSpace->ToString().c_str() : "<nullptr>");
    s += "]";
    return s;
}